

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

uint add_one_chunk(png_bytep list,uint count,png_const_bytep add,int keep)

{
  uint local_30;
  uint i;
  int keep_local;
  png_const_bytep add_local;
  int *piStack_18;
  uint count_local;
  png_bytep list_local;
  
  local_30 = 0;
  piStack_18 = (int *)list;
  while( true ) {
    if (count <= local_30) {
      add_local._4_4_ = count;
      if (keep != 0) {
        add_local._4_4_ = count + 1;
        *piStack_18 = *(int *)add;
        *(char *)(piStack_18 + 1) = (char)keep;
      }
      return add_local._4_4_;
    }
    if (*piStack_18 == *(int *)add) break;
    local_30 = local_30 + 1;
    piStack_18 = (int *)((long)piStack_18 + 5);
  }
  *(char *)(piStack_18 + 1) = (char)keep;
  return count;
}

Assistant:

static unsigned int
add_one_chunk(png_bytep list, unsigned int count, png_const_bytep add, int keep)
{
   unsigned int i;

   /* Utility function: update the 'keep' state of a chunk if it is already in
    * the list, otherwise add it to the list.
    */
   for (i=0; i<count; ++i, list += 5)
   {
      if (memcmp(list, add, 4) == 0)
      {
         list[4] = (png_byte)keep;

         return count;
      }
   }

   if (keep != PNG_HANDLE_CHUNK_AS_DEFAULT)
   {
      ++count;
      memcpy(list, add, 4);
      list[4] = (png_byte)keep;
   }

   return count;
}